

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Scene *pSVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  uint uVar16;
  undefined8 *puVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 (*pauVar38) [16];
  uint uVar39;
  AABBNodeMB4D *node1;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  int iVar45;
  ulong uVar46;
  undefined1 (*pauVar47) [16];
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [16];
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  RayHitK<4> *pRVar62;
  long lVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  float fVar105;
  float fVar106;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar126;
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [64];
  float fVar130;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar131 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [32];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar157 [32];
  float fVar158;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar159 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2aa0) [16];
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 *local_2a30;
  ulong local_2a28;
  ulong local_2a20;
  ulong local_2a18;
  undefined8 *local_2a10;
  RayHitK<4> *local_2a08;
  long local_2a00;
  ulong local_29f8;
  ulong local_29f0;
  long local_29e8;
  ulong local_29e0;
  long local_29d8;
  RTCFilterFunctionNArguments local_29d0;
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  float local_28e0;
  float fStack_28dc;
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  float fStack_28c4;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  RTCHitN local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined4 local_2730;
  undefined4 uStack_272c;
  undefined4 uStack_2728;
  undefined4 uStack_2724;
  undefined4 local_2720;
  undefined4 uStack_271c;
  undefined4 uStack_2718;
  undefined4 uStack_2714;
  uint local_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [32];
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [8];
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_2aa0 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_2420._4_4_ = uVar1;
  local_2420._0_4_ = uVar1;
  local_2420._8_4_ = uVar1;
  local_2420._12_4_ = uVar1;
  local_2420._16_4_ = uVar1;
  local_2420._20_4_ = uVar1;
  local_2420._24_4_ = uVar1;
  local_2420._28_4_ = uVar1;
  auVar114 = ZEXT3264(local_2420);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2440._4_4_ = uVar1;
  local_2440._0_4_ = uVar1;
  local_2440._8_4_ = uVar1;
  local_2440._12_4_ = uVar1;
  local_2440._16_4_ = uVar1;
  local_2440._20_4_ = uVar1;
  local_2440._24_4_ = uVar1;
  local_2440._28_4_ = uVar1;
  auVar117 = ZEXT3264(local_2440);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2460._4_4_ = uVar1;
  local_2460._0_4_ = uVar1;
  local_2460._8_4_ = uVar1;
  local_2460._12_4_ = uVar1;
  local_2460._16_4_ = uVar1;
  local_2460._20_4_ = uVar1;
  local_2460._24_4_ = uVar1;
  local_2460._28_4_ = uVar1;
  auVar123 = ZEXT3264(local_2460);
  local_24e0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2500 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2520 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2480 = local_24e0 * 0.99999964;
  local_24a0 = local_2500 * 0.99999964;
  local_24c0 = local_2520 * 0.99999964;
  local_24e0 = local_24e0 * 1.0000004;
  local_2500 = local_2500 * 1.0000004;
  local_2520 = local_2520 * 1.0000004;
  local_2a18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2a20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2a28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar46 = local_2a18 ^ 0x20;
  uVar54 = local_2a20 ^ 0x20;
  iVar45 = (tray->tnear).field_0.i[k];
  local_2980._4_4_ = iVar45;
  local_2980._0_4_ = iVar45;
  local_2980._8_4_ = iVar45;
  local_2980._12_4_ = iVar45;
  local_2980._16_4_ = iVar45;
  local_2980._20_4_ = iVar45;
  local_2980._24_4_ = iVar45;
  local_2980._28_4_ = iVar45;
  auVar170 = ZEXT3264(local_2980);
  local_29f8 = local_2a28 ^ 0x20;
  iVar45 = (tray->tfar).field_0.i[k];
  auVar68 = ZEXT3264(CONCAT428(iVar45,CONCAT424(iVar45,CONCAT420(iVar45,CONCAT416(iVar45,CONCAT412(
                                                  iVar45,CONCAT48(iVar45,CONCAT44(iVar45,iVar45)))))
                                               )));
  local_23e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_23e0._0_16_ = mm_lookupmask_ps._0_16_;
  local_2a10 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar90._8_4_ = 0x3f800000;
  auVar90._0_8_ = &DAT_3f8000003f800000;
  auVar90._12_4_ = 0x3f800000;
  auVar90._16_4_ = 0x3f800000;
  auVar90._20_4_ = 0x3f800000;
  auVar90._24_4_ = 0x3f800000;
  auVar90._28_4_ = 0x3f800000;
  auVar73._8_4_ = 0xbf800000;
  auVar73._0_8_ = 0xbf800000bf800000;
  auVar73._12_4_ = 0xbf800000;
  auVar73._16_4_ = 0xbf800000;
  auVar73._20_4_ = 0xbf800000;
  auVar73._24_4_ = 0xbf800000;
  auVar73._28_4_ = 0xbf800000;
  _local_2400 = vblendvps_avx(auVar90,auVar73,local_23e0);
  fStack_247c = local_2480;
  fStack_2478 = local_2480;
  fStack_2474 = local_2480;
  fStack_2470 = local_2480;
  fStack_246c = local_2480;
  fStack_2468 = local_2480;
  fStack_2464 = local_2480;
  fStack_249c = local_24a0;
  fStack_2498 = local_24a0;
  fStack_2494 = local_24a0;
  fStack_2490 = local_24a0;
  fStack_248c = local_24a0;
  fStack_2488 = local_24a0;
  fStack_2484 = local_24a0;
  fStack_24bc = local_24c0;
  fStack_24b8 = local_24c0;
  fStack_24b4 = local_24c0;
  fStack_24b0 = local_24c0;
  fStack_24ac = local_24c0;
  fStack_24a8 = local_24c0;
  fStack_24a4 = local_24c0;
  fStack_24dc = local_24e0;
  fStack_24d8 = local_24e0;
  fStack_24d4 = local_24e0;
  fStack_24d0 = local_24e0;
  fStack_24cc = local_24e0;
  fStack_24c8 = local_24e0;
  fStack_24c4 = local_24e0;
  fStack_24fc = local_2500;
  fStack_24f8 = local_2500;
  fStack_24f4 = local_2500;
  fStack_24f0 = local_2500;
  fStack_24ec = local_2500;
  fStack_24e8 = local_2500;
  fStack_24e4 = local_2500;
  fStack_251c = local_2520;
  fStack_2518 = local_2520;
  fStack_2514 = local_2520;
  fStack_2510 = local_2520;
  fStack_250c = local_2520;
  fStack_2508 = local_2520;
  fStack_2504 = local_2520;
  uVar44 = local_2a20;
  uVar42 = local_2a18;
  uVar48 = local_2a28;
  fVar130 = local_2480;
  fVar134 = local_2480;
  fVar135 = local_2480;
  fVar136 = local_2480;
  fVar137 = local_2480;
  fVar138 = local_2480;
  fVar139 = local_2480;
  fVar100 = local_24a0;
  fVar105 = local_24a0;
  fVar106 = local_24a0;
  fVar107 = local_24a0;
  fVar108 = local_24a0;
  fVar109 = local_24a0;
  fVar110 = local_24a0;
  fVar142 = local_24c0;
  fVar144 = local_24c0;
  fVar145 = local_24c0;
  fVar146 = local_24c0;
  fVar147 = local_24c0;
  fVar148 = local_24c0;
  fVar149 = local_24c0;
  fVar150 = local_24e0;
  fVar151 = local_24e0;
  fVar152 = local_24e0;
  fVar153 = local_24e0;
  fVar154 = local_24e0;
  fVar155 = local_24e0;
  fVar156 = local_24e0;
  fVar118 = local_2500;
  fVar124 = local_2500;
  fVar125 = local_2500;
  fVar126 = local_2500;
  fVar127 = local_2500;
  fVar128 = local_2500;
  fVar129 = local_2500;
  fVar158 = local_2520;
  fVar162 = local_2520;
  fVar163 = local_2520;
  fVar164 = local_2520;
  fVar165 = local_2520;
  fVar166 = local_2520;
  fVar167 = local_2520;
  local_2a30 = local_2a10;
  local_2a08 = ray;
  do {
    do {
      do {
        if (local_2aa0 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar38 = local_2aa0 + -1;
        local_2aa0 = local_2aa0 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar38 + 8));
      uVar61 = *(ulong *)*local_2aa0;
      do {
        auVar79 = auVar123._0_32_;
        auVar90 = auVar117._0_32_;
        auVar73 = auVar114._0_32_;
        if ((uVar61 & 8) == 0) {
          uVar40 = uVar61 & 0xfffffffffffffff0;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar74._4_4_ = uVar1;
          auVar74._0_4_ = uVar1;
          auVar74._8_4_ = uVar1;
          auVar74._12_4_ = uVar1;
          auVar74._16_4_ = uVar1;
          auVar74._20_4_ = uVar1;
          auVar74._24_4_ = uVar1;
          auVar74._28_4_ = uVar1;
          auVar69 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar40 + 0x100 + uVar42),auVar74,
                                    *(undefined1 (*) [32])(uVar40 + 0x40 + uVar42));
          auVar75 = vsubps_avx(ZEXT1632(auVar69),auVar73);
          auVar11._4_4_ = fVar134 * auVar75._4_4_;
          auVar11._0_4_ = fVar130 * auVar75._0_4_;
          auVar11._8_4_ = fVar135 * auVar75._8_4_;
          auVar11._12_4_ = fVar136 * auVar75._12_4_;
          auVar11._16_4_ = fVar137 * auVar75._16_4_;
          auVar11._20_4_ = fVar138 * auVar75._20_4_;
          auVar11._24_4_ = fVar139 * auVar75._24_4_;
          auVar11._28_4_ = auVar75._28_4_;
          auVar69 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar40 + 0x100 + uVar44),auVar74,
                                    *(undefined1 (*) [32])(uVar40 + 0x40 + uVar44));
          auVar75 = vmaxps_avx(auVar170._0_32_,auVar11);
          auVar11 = vsubps_avx(ZEXT1632(auVar69),auVar90);
          auVar12._4_4_ = fVar105 * auVar11._4_4_;
          auVar12._0_4_ = fVar100 * auVar11._0_4_;
          auVar12._8_4_ = fVar106 * auVar11._8_4_;
          auVar12._12_4_ = fVar107 * auVar11._12_4_;
          auVar12._16_4_ = fVar108 * auVar11._16_4_;
          auVar12._20_4_ = fVar109 * auVar11._20_4_;
          auVar12._24_4_ = fVar110 * auVar11._24_4_;
          auVar12._28_4_ = auVar11._28_4_;
          auVar69 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar40 + 0x100 + uVar48),auVar74,
                                    *(undefined1 (*) [32])(uVar40 + 0x40 + uVar48));
          auVar11 = vsubps_avx(ZEXT1632(auVar69),auVar79);
          auVar13._4_4_ = fVar144 * auVar11._4_4_;
          auVar13._0_4_ = fVar142 * auVar11._0_4_;
          auVar13._8_4_ = fVar145 * auVar11._8_4_;
          auVar13._12_4_ = fVar146 * auVar11._12_4_;
          auVar13._16_4_ = fVar147 * auVar11._16_4_;
          auVar13._20_4_ = fVar148 * auVar11._20_4_;
          auVar13._24_4_ = fVar149 * auVar11._24_4_;
          auVar13._28_4_ = auVar11._28_4_;
          auVar11 = vmaxps_avx(auVar12,auVar13);
          auVar69 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar40 + 0x100 + uVar46),auVar74,
                                    *(undefined1 (*) [32])(uVar40 + 0x40 + uVar46));
          local_26e0 = vmaxps_avx(auVar75,auVar11);
          auVar75 = vsubps_avx(ZEXT1632(auVar69),auVar73);
          auVar14._4_4_ = fVar151 * auVar75._4_4_;
          auVar14._0_4_ = fVar150 * auVar75._0_4_;
          auVar14._8_4_ = fVar152 * auVar75._8_4_;
          auVar14._12_4_ = fVar153 * auVar75._12_4_;
          auVar14._16_4_ = fVar154 * auVar75._16_4_;
          auVar14._20_4_ = fVar155 * auVar75._20_4_;
          auVar14._24_4_ = fVar156 * auVar75._24_4_;
          auVar14._28_4_ = auVar75._28_4_;
          auVar69 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar40 + 0x100 + uVar54),auVar74,
                                    *(undefined1 (*) [32])(uVar40 + 0x40 + uVar54));
          auVar75 = vsubps_avx(ZEXT1632(auVar69),auVar90);
          auVar18._4_4_ = fVar124 * auVar75._4_4_;
          auVar18._0_4_ = fVar118 * auVar75._0_4_;
          auVar18._8_4_ = fVar125 * auVar75._8_4_;
          auVar18._12_4_ = fVar126 * auVar75._12_4_;
          auVar18._16_4_ = fVar127 * auVar75._16_4_;
          auVar18._20_4_ = fVar128 * auVar75._20_4_;
          auVar18._24_4_ = fVar129 * auVar75._24_4_;
          auVar18._28_4_ = auVar75._28_4_;
          auVar69 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar40 + 0x100 + local_29f8),auVar74,
                                    *(undefined1 (*) [32])(uVar40 + 0x40 + local_29f8));
          auVar75 = vsubps_avx(ZEXT1632(auVar69),auVar79);
          auVar19._4_4_ = fVar162 * auVar75._4_4_;
          auVar19._0_4_ = fVar158 * auVar75._0_4_;
          auVar19._8_4_ = fVar163 * auVar75._8_4_;
          auVar19._12_4_ = fVar164 * auVar75._12_4_;
          auVar19._16_4_ = fVar165 * auVar75._16_4_;
          auVar19._20_4_ = fVar166 * auVar75._20_4_;
          auVar19._24_4_ = fVar167 * auVar75._24_4_;
          auVar19._28_4_ = auVar75._28_4_;
          auVar75 = vminps_avx(auVar18,auVar19);
          auVar11 = vminps_avx(auVar68._0_32_,auVar14);
          auVar75 = vminps_avx(auVar11,auVar75);
          auVar75 = vcmpps_avx(local_26e0,auVar75,2);
          if (((uint)uVar61 & 7) == 6) {
            auVar11 = vcmpps_avx(*(undefined1 (*) [32])(uVar40 + 0x1c0),auVar74,2);
            auVar12 = vcmpps_avx(auVar74,*(undefined1 (*) [32])(uVar40 + 0x1e0),1);
            auVar11 = vandps_avx(auVar11,auVar12);
            auVar75 = vandps_avx(auVar11,auVar75);
            auVar69 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
          }
          else {
            auVar69 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
          }
          auVar69 = vpsllw_avx(auVar69,0xf);
          auVar69 = vpacksswb_avx(auVar69,auVar69);
          local_2a10 = (undefined8 *)
                       (ulong)(byte)(SUB161(auVar69 >> 7,0) & 1 |
                                     (SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar69 >> 0x3f,0) << 7);
        }
        if ((uVar61 & 8) == 0) {
          if (local_2a10 == (undefined8 *)0x0) {
            iVar45 = 4;
          }
          else {
            uVar40 = uVar61 & 0xfffffffffffffff0;
            lVar43 = 0;
            for (puVar17 = local_2a10; ((ulong)puVar17 & 1) == 0;
                puVar17 = (undefined8 *)((ulong)puVar17 >> 1 | 0x8000000000000000)) {
              lVar43 = lVar43 + 1;
            }
            iVar45 = 0;
            uVar51 = (long)local_2a10 - 1U & (ulong)local_2a10;
            uVar61 = *(ulong *)(uVar40 + lVar43 * 8);
            if (uVar51 != 0) {
              uVar16 = *(uint *)(local_26e0 + lVar43 * 4);
              lVar43 = 0;
              for (uVar49 = uVar51; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                lVar43 = lVar43 + 1;
              }
              uVar51 = uVar51 - 1 & uVar51;
              uVar49 = *(ulong *)(uVar40 + lVar43 * 8);
              uVar39 = *(uint *)(local_26e0 + lVar43 * 4);
              if (uVar51 == 0) {
                if (uVar16 < uVar39) {
                  *(ulong *)*local_2aa0 = uVar49;
                  *(uint *)(*local_2aa0 + 8) = uVar39;
                  local_2aa0 = local_2aa0 + 1;
                }
                else {
                  *(ulong *)*local_2aa0 = uVar61;
                  *(uint *)(*local_2aa0 + 8) = uVar16;
                  uVar61 = uVar49;
                  local_2aa0 = local_2aa0 + 1;
                }
              }
              else {
                auVar69._8_8_ = 0;
                auVar69._0_8_ = uVar61;
                auVar69 = vpunpcklqdq_avx(auVar69,ZEXT416(uVar16));
                auVar81._8_8_ = 0;
                auVar81._0_8_ = uVar49;
                auVar81 = vpunpcklqdq_avx(auVar81,ZEXT416(uVar39));
                lVar43 = 0;
                for (uVar61 = uVar51; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000)
                {
                  lVar43 = lVar43 + 1;
                }
                uVar51 = uVar51 - 1 & uVar51;
                auVar88._8_8_ = 0;
                auVar88._0_8_ = *(ulong *)(uVar40 + lVar43 * 8);
                auVar70 = vpunpcklqdq_avx(auVar88,ZEXT416(*(uint *)(local_26e0 + lVar43 * 4)));
                auVar88 = vpcmpgtd_avx(auVar81,auVar69);
                if (uVar51 == 0) {
                  auVar101 = vpshufd_avx(auVar88,0xaa);
                  auVar88 = vblendvps_avx(auVar81,auVar69,auVar101);
                  auVar69 = vblendvps_avx(auVar69,auVar81,auVar101);
                  auVar81 = vpcmpgtd_avx(auVar70,auVar88);
                  auVar101 = vpshufd_avx(auVar81,0xaa);
                  auVar81 = vblendvps_avx(auVar70,auVar88,auVar101);
                  auVar88 = vblendvps_avx(auVar88,auVar70,auVar101);
                  auVar70 = vpcmpgtd_avx(auVar88,auVar69);
                  auVar101 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar88,auVar69,auVar101);
                  auVar69 = vblendvps_avx(auVar69,auVar88,auVar101);
                  *local_2aa0 = auVar69;
                  local_2aa0[1] = auVar70;
                  uVar61 = auVar81._0_8_;
                  local_2aa0 = local_2aa0 + 2;
                }
                else {
                  lVar43 = 0;
                  for (uVar61 = uVar51; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000
                      ) {
                    lVar43 = lVar43 + 1;
                  }
                  uVar51 = uVar51 - 1 & uVar51;
                  auVar101._8_8_ = 0;
                  auVar101._0_8_ = *(ulong *)(uVar40 + lVar43 * 8);
                  auVar101 = vpunpcklqdq_avx(auVar101,ZEXT416(*(uint *)(local_26e0 + lVar43 * 4)));
                  if (uVar51 == 0) {
                    auVar82 = vpshufd_avx(auVar88,0xaa);
                    auVar88 = vblendvps_avx(auVar81,auVar69,auVar82);
                    auVar69 = vblendvps_avx(auVar69,auVar81,auVar82);
                    auVar81 = vpcmpgtd_avx(auVar101,auVar70);
                    auVar82 = vpshufd_avx(auVar81,0xaa);
                    auVar81 = vblendvps_avx(auVar101,auVar70,auVar82);
                    auVar70 = vblendvps_avx(auVar70,auVar101,auVar82);
                    auVar101 = vpcmpgtd_avx(auVar70,auVar69);
                    auVar82 = vpshufd_avx(auVar101,0xaa);
                    auVar101 = vblendvps_avx(auVar70,auVar69,auVar82);
                    auVar69 = vblendvps_avx(auVar69,auVar70,auVar82);
                    auVar70 = vpcmpgtd_avx(auVar81,auVar88);
                    auVar82 = vpshufd_avx(auVar70,0xaa);
                    auVar70 = vblendvps_avx(auVar81,auVar88,auVar82);
                    auVar81 = vblendvps_avx(auVar88,auVar81,auVar82);
                    auVar88 = vpcmpgtd_avx(auVar101,auVar81);
                    auVar82 = vpshufd_avx(auVar88,0xaa);
                    auVar88 = vblendvps_avx(auVar101,auVar81,auVar82);
                    auVar81 = vblendvps_avx(auVar81,auVar101,auVar82);
                    *local_2aa0 = auVar69;
                    local_2aa0[1] = auVar81;
                    local_2aa0[2] = auVar88;
                    uVar61 = auVar70._0_8_;
                    local_2aa0 = local_2aa0 + 3;
                  }
                  else {
                    *local_2aa0 = auVar69;
                    local_2aa0[1] = auVar81;
                    local_2aa0[2] = auVar70;
                    local_2aa0[3] = auVar101;
                    lVar43 = 0x30;
                    do {
                      lVar41 = lVar43;
                      lVar43 = 0;
                      for (uVar61 = uVar51; (uVar61 & 1) == 0;
                          uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                        lVar43 = lVar43 + 1;
                      }
                      auVar70._8_8_ = 0;
                      auVar70._0_8_ = *(ulong *)(uVar40 + lVar43 * 8);
                      auVar69 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_26e0 + lVar43 * 4)))
                      ;
                      *(undefined1 (*) [16])(local_2aa0[1] + lVar41) = auVar69;
                      uVar51 = uVar51 - 1 & uVar51;
                      lVar43 = lVar41 + 0x10;
                    } while (uVar51 != 0);
                    pauVar38 = (undefined1 (*) [16])(local_2aa0[1] + lVar41);
                    if (lVar41 + 0x10 != 0) {
                      lVar43 = 0x10;
                      pauVar47 = local_2aa0;
                      do {
                        auVar69 = pauVar47[1];
                        uVar16 = *(uint *)(pauVar47[1] + 8);
                        pauVar47 = pauVar47 + 1;
                        lVar41 = lVar43;
                        do {
                          if (uVar16 <= *(uint *)(local_2aa0[-1] + lVar41 + 8)) {
                            pauVar52 = (undefined1 (*) [16])(*local_2aa0 + lVar41);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_2aa0 + lVar41) =
                               *(undefined1 (*) [16])(local_2aa0[-1] + lVar41);
                          lVar41 = lVar41 + -0x10;
                          pauVar52 = local_2aa0;
                        } while (lVar41 != 0);
                        *pauVar52 = auVar69;
                        lVar43 = lVar43 + 0x10;
                      } while (pauVar38 != pauVar47);
                    }
                    uVar61 = *(ulong *)*pauVar38;
                    local_2aa0 = pauVar38;
                  }
                  auVar114 = ZEXT3264(auVar73);
                  auVar117 = ZEXT3264(auVar90);
                  auVar123 = ZEXT3264(auVar79);
                  auVar170 = ZEXT3264(local_2980);
                }
              }
            }
          }
        }
        else {
          iVar45 = 6;
        }
      } while (iVar45 == 0);
    } while (iVar45 != 6);
    local_2a00 = (ulong)((uint)uVar61 & 0xf) - 8;
    if (local_2a00 != 0) {
      uVar61 = uVar61 & 0xfffffffffffffff0;
      local_29d8 = 0;
      pRVar62 = ray;
      do {
        ray = local_2a08;
        lVar41 = local_29d8 * 0x60;
        pSVar5 = context->scene;
        pRVar6 = (pSVar5->geometries).items;
        pGVar7 = pRVar6[*(uint *)(uVar61 + 0x40 + lVar41)].ptr;
        fVar130 = (pGVar7->time_range).lower;
        fVar130 = pGVar7->fnumTimeSegments *
                  ((*(float *)(pRVar62 + k * 4 + 0x70) - fVar130) /
                  ((pGVar7->time_range).upper - fVar130));
        auVar69 = vroundss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),9);
        auVar69 = vminss_avx(auVar69,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
        auVar102 = vmaxss_avx(ZEXT816(0) << 0x20,auVar69);
        iVar45 = (int)auVar102._0_4_;
        lVar55 = (long)iVar45 * 0x38;
        lVar43 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar55);
        uVar53 = (ulong)*(uint *)(uVar61 + 4 + lVar41);
        auVar69 = *(undefined1 (*) [16])(lVar43 + (ulong)*(uint *)(uVar61 + lVar41) * 4);
        uVar44 = (ulong)*(uint *)(uVar61 + 0x10 + lVar41);
        auVar81 = *(undefined1 (*) [16])(lVar43 + uVar44 * 4);
        uVar42 = (ulong)*(uint *)(uVar61 + 0x20 + lVar41);
        auVar88 = *(undefined1 (*) [16])(lVar43 + uVar42 * 4);
        uVar48 = (ulong)*(uint *)(uVar61 + 0x30 + lVar41);
        auVar70 = *(undefined1 (*) [16])(lVar43 + uVar48 * 4);
        local_29e8 = *(long *)&pRVar6[*(uint *)(uVar61 + 0x44 + lVar41)].ptr[2].numPrimitives;
        lVar43 = *(long *)(local_29e8 + lVar55);
        auVar101 = *(undefined1 (*) [16])(lVar43 + uVar53 * 4);
        uVar40 = (ulong)*(uint *)(uVar61 + 0x14 + lVar41);
        auVar82 = *(undefined1 (*) [16])(lVar43 + uVar40 * 4);
        uVar51 = (ulong)*(uint *)(uVar61 + 0x24 + lVar41);
        auVar3 = *(undefined1 (*) [16])(lVar43 + uVar51 * 4);
        uVar49 = (ulong)*(uint *)(uVar61 + 0x34 + lVar41);
        auVar64 = *(undefined1 (*) [16])(lVar43 + uVar49 * 4);
        lVar43 = *(long *)&pRVar6[*(uint *)(uVar61 + 0x48 + lVar41)].ptr[2].numPrimitives;
        lVar8 = *(long *)(lVar43 + lVar55);
        uVar50 = (ulong)*(uint *)(uVar61 + 8 + lVar41);
        auVar89 = *(undefined1 (*) [16])(lVar8 + uVar50 * 4);
        local_29f0 = (ulong)*(uint *)(uVar61 + 0x18 + lVar41);
        auVar168 = *(undefined1 (*) [16])(lVar8 + local_29f0 * 4);
        local_29e0 = (ulong)*(uint *)(uVar61 + 0x28 + lVar41);
        auVar4 = *(undefined1 (*) [16])(lVar8 + local_29e0 * 4);
        uVar57 = (ulong)*(uint *)(uVar61 + 0x38 + lVar41);
        auVar131 = *(undefined1 (*) [16])(lVar8 + uVar57 * 4);
        fVar130 = fVar130 - auVar102._0_4_;
        lVar8 = *(long *)&pRVar6[*(uint *)(uVar61 + 0x4c + lVar41)].ptr[2].numPrimitives;
        lVar55 = *(long *)(lVar8 + lVar55);
        uVar56 = (ulong)*(uint *)(uVar61 + 0xc + lVar41);
        auVar102 = *(undefined1 (*) [16])(lVar55 + uVar56 * 4);
        uVar59 = (ulong)*(uint *)(uVar61 + 0x1c + lVar41);
        auVar115 = *(undefined1 (*) [16])(lVar55 + uVar59 * 4);
        auVar119 = vunpcklps_avx(auVar69,auVar89);
        auVar89 = vunpckhps_avx(auVar69,auVar89);
        auVar140 = vunpcklps_avx(auVar101,auVar102);
        auVar101 = vunpckhps_avx(auVar101,auVar102);
        uVar58 = (ulong)*(uint *)(uVar61 + 0x2c + lVar41);
        auVar69 = *(undefined1 (*) [16])(lVar55 + uVar58 * 4);
        auVar102 = vunpcklps_avx(auVar89,auVar101);
        local_27b0 = vunpcklps_avx(auVar119,auVar140);
        auVar101 = vunpckhps_avx(auVar119,auVar140);
        auVar119 = vunpcklps_avx(auVar81,auVar168);
        auVar89 = vunpckhps_avx(auVar81,auVar168);
        auVar168 = vunpcklps_avx(auVar82,auVar115);
        auVar82 = vunpckhps_avx(auVar82,auVar115);
        uVar60 = (ulong)*(uint *)(uVar61 + 0x3c + lVar41);
        auVar81 = *(undefined1 (*) [16])(lVar55 + uVar60 * 4);
        auVar89 = vunpcklps_avx(auVar89,auVar82);
        auVar115 = vunpcklps_avx(auVar119,auVar168);
        auVar82 = vunpckhps_avx(auVar119,auVar168);
        auVar168 = vunpcklps_avx(auVar88,auVar4);
        auVar88 = vunpckhps_avx(auVar88,auVar4);
        auVar4 = vunpcklps_avx(auVar3,auVar69);
        auVar3 = vunpckhps_avx(auVar3,auVar69);
        lVar63 = (long)(iVar45 + 1) * 0x38;
        lVar55 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar63);
        auVar69 = *(undefined1 (*) [16])(lVar55 + (ulong)*(uint *)(uVar61 + lVar41) * 4);
        local_27c0 = vunpcklps_avx(auVar88,auVar3);
        auVar119 = vunpcklps_avx(auVar168,auVar4);
        local_2800 = vunpckhps_avx(auVar168,auVar4);
        auVar3 = vunpcklps_avx(auVar70,auVar131);
        auVar88 = vunpckhps_avx(auVar70,auVar131);
        auVar168 = vunpcklps_avx(auVar64,auVar81);
        auVar70 = vunpckhps_avx(auVar64,auVar81);
        lVar43 = *(long *)(lVar43 + lVar63);
        auVar81 = *(undefined1 (*) [16])(lVar43 + uVar50 * 4);
        local_27d0 = vunpcklps_avx(auVar88,auVar70);
        local_27e0 = vunpcklps_avx(auVar3,auVar168);
        local_27f0 = vunpckhps_avx(auVar3,auVar168);
        lVar9 = *(long *)(local_29e8 + lVar63);
        auVar70 = vunpcklps_avx(auVar69,auVar81);
        auVar88 = vunpckhps_avx(auVar69,auVar81);
        auVar69 = *(undefined1 (*) [16])(lVar9 + uVar53 * 4);
        lVar8 = *(long *)(lVar8 + lVar63);
        auVar81 = *(undefined1 (*) [16])(lVar8 + uVar56 * 4);
        auVar3 = vunpcklps_avx(auVar69,auVar81);
        auVar69 = vunpckhps_avx(auVar69,auVar81);
        auVar168 = vunpcklps_avx(auVar88,auVar69);
        auVar4 = vunpcklps_avx(auVar70,auVar3);
        auVar88 = vunpckhps_avx(auVar70,auVar3);
        auVar69 = *(undefined1 (*) [16])(lVar55 + uVar44 * 4);
        auVar81 = *(undefined1 (*) [16])(lVar43 + local_29f0 * 4);
        auVar3 = vunpcklps_avx(auVar69,auVar81);
        auVar70 = vunpckhps_avx(auVar69,auVar81);
        auVar69 = *(undefined1 (*) [16])(lVar9 + uVar40 * 4);
        auVar81 = *(undefined1 (*) [16])(lVar8 + uVar59 * 4);
        auVar64 = vunpcklps_avx(auVar69,auVar81);
        auVar69 = vunpckhps_avx(auVar69,auVar81);
        auVar131 = vunpcklps_avx(auVar70,auVar69);
        auVar140 = vunpcklps_avx(auVar3,auVar64);
        auVar70 = vunpckhps_avx(auVar3,auVar64);
        auVar69 = *(undefined1 (*) [16])(lVar55 + uVar42 * 4);
        auVar81 = *(undefined1 (*) [16])(lVar43 + local_29e0 * 4);
        auVar64 = vunpcklps_avx(auVar69,auVar81);
        auVar3 = vunpckhps_avx(auVar69,auVar81);
        auVar69 = *(undefined1 (*) [16])(lVar9 + uVar51 * 4);
        auVar81 = *(undefined1 (*) [16])(lVar8 + uVar58 * 4);
        auVar71 = vunpcklps_avx(auVar69,auVar81);
        auVar69 = vunpckhps_avx(auVar69,auVar81);
        auVar72 = vunpcklps_avx(auVar3,auVar69);
        auVar15 = vunpcklps_avx(auVar64,auVar71);
        auVar3 = vunpckhps_avx(auVar64,auVar71);
        auVar69 = *(undefined1 (*) [16])(lVar55 + uVar48 * 4);
        auVar81 = *(undefined1 (*) [16])(lVar43 + uVar57 * 4);
        auVar71 = vunpcklps_avx(auVar69,auVar81);
        auVar64 = vunpckhps_avx(auVar69,auVar81);
        auVar69 = *(undefined1 (*) [16])(lVar9 + uVar49 * 4);
        auVar81 = *(undefined1 (*) [16])(lVar8 + uVar60 * 4);
        auVar94 = vunpcklps_avx(auVar69,auVar81);
        auVar69 = vunpckhps_avx(auVar69,auVar81);
        auVar81 = vunpcklps_avx(auVar64,auVar69);
        auVar64 = vunpcklps_avx(auVar71,auVar94);
        auVar69 = vunpckhps_avx(auVar71,auVar94);
        fVar134 = 1.0 - fVar130;
        auVar159._4_4_ = fVar134;
        auVar159._0_4_ = fVar134;
        auVar159._8_4_ = fVar134;
        auVar159._12_4_ = fVar134;
        auVar71._0_4_ = fVar130 * auVar4._0_4_;
        auVar71._4_4_ = fVar130 * auVar4._4_4_;
        auVar71._8_4_ = fVar130 * auVar4._8_4_;
        auVar71._12_4_ = fVar130 * auVar4._12_4_;
        auVar4 = vfmadd231ps_fma(auVar71,auVar159,local_27b0);
        auVar111._0_4_ = fVar130 * auVar88._0_4_;
        auVar111._4_4_ = fVar130 * auVar88._4_4_;
        auVar111._8_4_ = fVar130 * auVar88._8_4_;
        auVar111._12_4_ = fVar130 * auVar88._12_4_;
        auVar88 = vfmadd231ps_fma(auVar111,auVar159,auVar101);
        auVar94._0_4_ = auVar168._0_4_ * fVar130;
        auVar94._4_4_ = auVar168._4_4_ * fVar130;
        auVar94._8_4_ = auVar168._8_4_ * fVar130;
        auVar94._12_4_ = auVar168._12_4_ * fVar130;
        auVar101 = vfmadd231ps_fma(auVar94,auVar159,auVar102);
        auVar168._0_4_ = fVar130 * auVar140._0_4_;
        auVar168._4_4_ = fVar130 * auVar140._4_4_;
        auVar168._8_4_ = fVar130 * auVar140._8_4_;
        auVar168._12_4_ = fVar130 * auVar140._12_4_;
        auVar168 = vfmadd231ps_fma(auVar168,auVar159,auVar115);
        auVar102._0_4_ = fVar130 * auVar70._0_4_;
        auVar102._4_4_ = fVar130 * auVar70._4_4_;
        auVar102._8_4_ = fVar130 * auVar70._8_4_;
        auVar102._12_4_ = fVar130 * auVar70._12_4_;
        auVar70 = vfmadd231ps_fma(auVar102,auVar159,auVar82);
        auVar82._0_4_ = auVar131._0_4_ * fVar130;
        auVar82._4_4_ = auVar131._4_4_ * fVar130;
        auVar82._8_4_ = auVar131._8_4_ * fVar130;
        auVar82._12_4_ = auVar131._12_4_ * fVar130;
        auVar82 = vfmadd231ps_fma(auVar82,auVar159,auVar89);
        auVar89._0_4_ = fVar130 * auVar15._0_4_;
        auVar89._4_4_ = fVar130 * auVar15._4_4_;
        auVar89._8_4_ = fVar130 * auVar15._8_4_;
        auVar89._12_4_ = fVar130 * auVar15._12_4_;
        auVar89 = vfmadd231ps_fma(auVar89,auVar159,auVar119);
        auVar131._0_4_ = auVar3._0_4_ * fVar130;
        auVar131._4_4_ = auVar3._4_4_ * fVar130;
        auVar131._8_4_ = auVar3._8_4_ * fVar130;
        auVar131._12_4_ = auVar3._12_4_ * fVar130;
        auVar3 = vfmadd231ps_fma(auVar131,auVar159,local_2800);
        auVar140._0_4_ = auVar72._0_4_ * fVar130;
        auVar140._4_4_ = auVar72._4_4_ * fVar130;
        auVar140._8_4_ = auVar72._8_4_ * fVar130;
        auVar140._12_4_ = auVar72._12_4_ * fVar130;
        auVar131 = vfmadd231ps_fma(auVar140,auVar159,local_27c0);
        auVar115._0_4_ = fVar130 * auVar64._0_4_;
        auVar115._4_4_ = fVar130 * auVar64._4_4_;
        auVar115._8_4_ = fVar130 * auVar64._8_4_;
        auVar115._12_4_ = fVar130 * auVar64._12_4_;
        auVar119._0_4_ = auVar69._0_4_ * fVar130;
        auVar119._4_4_ = auVar69._4_4_ * fVar130;
        auVar119._8_4_ = auVar69._8_4_ * fVar130;
        auVar119._12_4_ = auVar69._12_4_ * fVar130;
        lVar43 = uVar61 + 0x40 + lVar41;
        local_23c0 = *(undefined8 *)(lVar43 + 0x10);
        uStack_23b8 = *(undefined8 *)(lVar43 + 0x18);
        auVar64._0_4_ = auVar81._0_4_ * fVar130;
        auVar64._4_4_ = auVar81._4_4_ * fVar130;
        auVar64._8_4_ = auVar81._8_4_ * fVar130;
        auVar64._12_4_ = auVar81._12_4_ * fVar130;
        uStack_23b0 = local_23c0;
        uStack_23a8 = uStack_23b8;
        lVar41 = uVar61 + 0x50 + lVar41;
        local_27a0 = *(undefined8 *)(lVar41 + 0x10);
        uStack_2798 = *(undefined8 *)(lVar41 + 0x18);
        auVar69 = vfmadd231ps_fma(auVar115,auVar159,local_27e0);
        auVar81 = vfmadd231ps_fma(auVar119,auVar159,local_27f0);
        auVar64 = vfmadd231ps_fma(auVar64,auVar159,local_27d0);
        uStack_2790 = local_27a0;
        uStack_2788 = uStack_2798;
        auVar75._16_16_ = auVar89;
        auVar75._0_16_ = auVar4;
        auVar91._16_16_ = auVar3;
        auVar91._0_16_ = auVar88;
        auVar95._16_16_ = auVar131;
        auVar95._0_16_ = auVar101;
        auVar132._16_16_ = auVar168;
        auVar132._0_16_ = auVar168;
        auVar103._16_16_ = auVar70;
        auVar103._0_16_ = auVar70;
        auVar83._16_16_ = auVar82;
        auVar83._0_16_ = auVar82;
        auVar169._16_16_ = auVar69;
        auVar169._0_16_ = auVar69;
        auVar120._16_16_ = auVar81;
        auVar120._0_16_ = auVar81;
        uVar1 = *(undefined4 *)(local_2a08 + k * 4);
        auVar143._4_4_ = uVar1;
        auVar143._0_4_ = uVar1;
        auVar143._8_4_ = uVar1;
        auVar143._12_4_ = uVar1;
        auVar143._16_4_ = uVar1;
        auVar143._20_4_ = uVar1;
        auVar143._24_4_ = uVar1;
        auVar143._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(local_2a08 + k * 4 + 0x10);
        auVar157._4_4_ = uVar1;
        auVar157._0_4_ = uVar1;
        auVar157._8_4_ = uVar1;
        auVar157._12_4_ = uVar1;
        auVar157._16_4_ = uVar1;
        auVar157._20_4_ = uVar1;
        auVar157._24_4_ = uVar1;
        auVar157._28_4_ = uVar1;
        auVar65._16_16_ = auVar64;
        auVar65._0_16_ = auVar64;
        uVar2 = *(undefined4 *)(local_2a08 + k * 4 + 0x20);
        auVar160._4_4_ = uVar2;
        auVar160._0_4_ = uVar2;
        auVar160._8_4_ = uVar2;
        auVar160._12_4_ = uVar2;
        auVar160._16_4_ = uVar2;
        auVar160._20_4_ = uVar2;
        auVar160._24_4_ = uVar2;
        auVar160._28_4_ = uVar2;
        local_2820 = vsubps_avx(auVar75,auVar143);
        local_2840 = vsubps_avx(auVar91,auVar157);
        local_2860 = vsubps_avx(auVar95,auVar160);
        auVar73 = vsubps_avx(auVar132,auVar143);
        auVar90 = vsubps_avx(auVar103,auVar157);
        auVar79 = vsubps_avx(auVar83,auVar160);
        auVar75 = vsubps_avx(auVar169,auVar143);
        auVar11 = vsubps_avx(auVar120,auVar157);
        auVar12 = vsubps_avx(auVar65,auVar160);
        local_2880 = vsubps_avx(auVar75,local_2820);
        local_28c0 = vsubps_avx(auVar11,local_2840);
        local_28a0 = vsubps_avx(auVar12,local_2860);
        auVar66._0_4_ = local_2820._0_4_ + auVar75._0_4_;
        auVar66._4_4_ = local_2820._4_4_ + auVar75._4_4_;
        auVar66._8_4_ = local_2820._8_4_ + auVar75._8_4_;
        auVar66._12_4_ = local_2820._12_4_ + auVar75._12_4_;
        auVar66._16_4_ = local_2820._16_4_ + auVar75._16_4_;
        auVar66._20_4_ = local_2820._20_4_ + auVar75._20_4_;
        auVar66._24_4_ = local_2820._24_4_ + auVar75._24_4_;
        auVar66._28_4_ = local_2820._28_4_ + auVar75._28_4_;
        auVar84._0_4_ = auVar11._0_4_ + local_2840._0_4_;
        auVar84._4_4_ = auVar11._4_4_ + local_2840._4_4_;
        auVar84._8_4_ = auVar11._8_4_ + local_2840._8_4_;
        auVar84._12_4_ = auVar11._12_4_ + local_2840._12_4_;
        auVar84._16_4_ = auVar11._16_4_ + local_2840._16_4_;
        auVar84._20_4_ = auVar11._20_4_ + local_2840._20_4_;
        auVar84._24_4_ = auVar11._24_4_ + local_2840._24_4_;
        fVar100 = local_2840._28_4_;
        auVar84._28_4_ = auVar11._28_4_ + fVar100;
        fVar130 = local_2860._0_4_;
        auVar96._0_4_ = auVar12._0_4_ + fVar130;
        fVar134 = local_2860._4_4_;
        auVar96._4_4_ = auVar12._4_4_ + fVar134;
        fVar135 = local_2860._8_4_;
        auVar96._8_4_ = auVar12._8_4_ + fVar135;
        fVar136 = local_2860._12_4_;
        auVar96._12_4_ = auVar12._12_4_ + fVar136;
        fVar137 = local_2860._16_4_;
        auVar96._16_4_ = auVar12._16_4_ + fVar137;
        fVar138 = local_2860._20_4_;
        auVar96._20_4_ = auVar12._20_4_ + fVar138;
        fVar139 = local_2860._24_4_;
        auVar96._24_4_ = auVar12._24_4_ + fVar139;
        auVar96._28_4_ = auVar12._28_4_ + local_2860._28_4_;
        auVar20._4_4_ = local_28a0._4_4_ * auVar84._4_4_;
        auVar20._0_4_ = local_28a0._0_4_ * auVar84._0_4_;
        auVar20._8_4_ = local_28a0._8_4_ * auVar84._8_4_;
        auVar20._12_4_ = local_28a0._12_4_ * auVar84._12_4_;
        auVar20._16_4_ = local_28a0._16_4_ * auVar84._16_4_;
        auVar20._20_4_ = local_28a0._20_4_ * auVar84._20_4_;
        auVar20._24_4_ = local_28a0._24_4_ * auVar84._24_4_;
        auVar20._28_4_ = uVar1;
        auVar81 = vfmsub231ps_fma(auVar20,local_28c0,auVar96);
        auVar21._4_4_ = local_2880._4_4_ * auVar96._4_4_;
        auVar21._0_4_ = local_2880._0_4_ * auVar96._0_4_;
        auVar21._8_4_ = local_2880._8_4_ * auVar96._8_4_;
        auVar21._12_4_ = local_2880._12_4_ * auVar96._12_4_;
        auVar21._16_4_ = local_2880._16_4_ * auVar96._16_4_;
        auVar21._20_4_ = local_2880._20_4_ * auVar96._20_4_;
        auVar21._24_4_ = local_2880._24_4_ * auVar96._24_4_;
        auVar21._28_4_ = auVar96._28_4_;
        auVar69 = vfmsub231ps_fma(auVar21,local_28a0,auVar66);
        auVar22._4_4_ = local_28c0._4_4_ * auVar66._4_4_;
        auVar22._0_4_ = local_28c0._0_4_ * auVar66._0_4_;
        auVar22._8_4_ = local_28c0._8_4_ * auVar66._8_4_;
        auVar22._12_4_ = local_28c0._12_4_ * auVar66._12_4_;
        auVar22._16_4_ = local_28c0._16_4_ * auVar66._16_4_;
        auVar22._20_4_ = local_28c0._20_4_ * auVar66._20_4_;
        auVar22._24_4_ = local_28c0._24_4_ * auVar66._24_4_;
        auVar22._28_4_ = auVar66._28_4_;
        auVar88 = vfmsub231ps_fma(auVar22,local_2880,auVar84);
        uVar1 = *(undefined4 *)(local_2a08 + k * 4 + 0x50);
        auVar161._4_4_ = uVar1;
        auVar161._0_4_ = uVar1;
        auVar161._8_4_ = uVar1;
        auVar161._12_4_ = uVar1;
        auVar161._16_4_ = uVar1;
        auVar161._20_4_ = uVar1;
        auVar161._24_4_ = uVar1;
        auVar161._28_4_ = uVar1;
        fStack_28d0 = *(float *)(local_2a08 + k * 4 + 0x60);
        auVar23._4_4_ = fStack_28d0 * auVar88._4_4_;
        auVar23._0_4_ = fStack_28d0 * auVar88._0_4_;
        auVar23._8_4_ = fStack_28d0 * auVar88._8_4_;
        auVar23._12_4_ = fStack_28d0 * auVar88._12_4_;
        auVar23._16_4_ = fStack_28d0 * 0.0;
        auVar23._20_4_ = fStack_28d0 * 0.0;
        auVar23._24_4_ = fStack_28d0 * 0.0;
        auVar23._28_4_ = local_28a0._28_4_;
        auVar69 = vfmadd231ps_fma(auVar23,auVar161,ZEXT1632(auVar69));
        uVar1 = *(undefined4 *)(local_2a08 + k * 4 + 0x40);
        auVar116._4_4_ = uVar1;
        auVar116._0_4_ = uVar1;
        auVar116._8_4_ = uVar1;
        auVar116._12_4_ = uVar1;
        auVar116._16_4_ = uVar1;
        auVar116._20_4_ = uVar1;
        auVar116._24_4_ = uVar1;
        auVar116._28_4_ = uVar1;
        auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar116,ZEXT1632(auVar81));
        local_2900 = vsubps_avx(local_2840,auVar90);
        local_2920 = vsubps_avx(local_2860,auVar79);
        auVar85._0_4_ = auVar90._0_4_ + local_2840._0_4_;
        auVar85._4_4_ = auVar90._4_4_ + local_2840._4_4_;
        auVar85._8_4_ = auVar90._8_4_ + local_2840._8_4_;
        auVar85._12_4_ = auVar90._12_4_ + local_2840._12_4_;
        auVar85._16_4_ = auVar90._16_4_ + local_2840._16_4_;
        auVar85._20_4_ = auVar90._20_4_ + local_2840._20_4_;
        auVar85._24_4_ = auVar90._24_4_ + local_2840._24_4_;
        auVar85._28_4_ = auVar90._28_4_ + fVar100;
        auVar97._0_4_ = fVar130 + auVar79._0_4_;
        auVar97._4_4_ = fVar134 + auVar79._4_4_;
        auVar97._8_4_ = fVar135 + auVar79._8_4_;
        auVar97._12_4_ = fVar136 + auVar79._12_4_;
        auVar97._16_4_ = fVar137 + auVar79._16_4_;
        auVar97._20_4_ = fVar138 + auVar79._20_4_;
        auVar97._24_4_ = fVar139 + auVar79._24_4_;
        auVar97._28_4_ = local_2860._28_4_ + auVar79._28_4_;
        fVar105 = local_2920._0_4_;
        fVar107 = local_2920._4_4_;
        auVar24._4_4_ = auVar85._4_4_ * fVar107;
        auVar24._0_4_ = auVar85._0_4_ * fVar105;
        fVar110 = local_2920._8_4_;
        auVar24._8_4_ = auVar85._8_4_ * fVar110;
        fVar145 = local_2920._12_4_;
        auVar24._12_4_ = auVar85._12_4_ * fVar145;
        fVar148 = local_2920._16_4_;
        auVar24._16_4_ = auVar85._16_4_ * fVar148;
        fVar151 = local_2920._20_4_;
        auVar24._20_4_ = auVar85._20_4_ * fVar151;
        fVar154 = local_2920._24_4_;
        auVar24._24_4_ = auVar85._24_4_ * fVar154;
        auVar24._28_4_ = fVar100;
        auVar88 = vfmsub231ps_fma(auVar24,local_2900,auVar97);
        auVar13 = vsubps_avx(local_2820,auVar73);
        fVar100 = auVar13._0_4_;
        fVar108 = auVar13._4_4_;
        auVar25._4_4_ = auVar97._4_4_ * fVar108;
        auVar25._0_4_ = auVar97._0_4_ * fVar100;
        fVar142 = auVar13._8_4_;
        auVar25._8_4_ = auVar97._8_4_ * fVar142;
        fVar146 = auVar13._12_4_;
        auVar25._12_4_ = auVar97._12_4_ * fVar146;
        fVar149 = auVar13._16_4_;
        auVar25._16_4_ = auVar97._16_4_ * fVar149;
        fVar152 = auVar13._20_4_;
        auVar25._20_4_ = auVar97._20_4_ * fVar152;
        fVar155 = auVar13._24_4_;
        auVar25._24_4_ = auVar97._24_4_ * fVar155;
        auVar25._28_4_ = auVar97._28_4_;
        auVar121._0_4_ = local_2820._0_4_ + auVar73._0_4_;
        auVar121._4_4_ = local_2820._4_4_ + auVar73._4_4_;
        auVar121._8_4_ = local_2820._8_4_ + auVar73._8_4_;
        auVar121._12_4_ = local_2820._12_4_ + auVar73._12_4_;
        auVar121._16_4_ = local_2820._16_4_ + auVar73._16_4_;
        auVar121._20_4_ = local_2820._20_4_ + auVar73._20_4_;
        auVar121._24_4_ = local_2820._24_4_ + auVar73._24_4_;
        auVar121._28_4_ = local_2820._28_4_ + auVar73._28_4_;
        auVar81 = vfmsub231ps_fma(auVar25,local_2920,auVar121);
        fVar106 = local_2900._0_4_;
        fVar109 = local_2900._4_4_;
        auVar26._4_4_ = auVar121._4_4_ * fVar109;
        auVar26._0_4_ = auVar121._0_4_ * fVar106;
        fVar144 = local_2900._8_4_;
        auVar26._8_4_ = auVar121._8_4_ * fVar144;
        fVar147 = local_2900._12_4_;
        auVar26._12_4_ = auVar121._12_4_ * fVar147;
        fVar150 = local_2900._16_4_;
        auVar26._16_4_ = auVar121._16_4_ * fVar150;
        fVar153 = local_2900._20_4_;
        auVar26._20_4_ = auVar121._20_4_ * fVar153;
        fVar156 = local_2900._24_4_;
        auVar26._24_4_ = auVar121._24_4_ * fVar156;
        auVar26._28_4_ = auVar121._28_4_;
        auVar70 = vfmsub231ps_fma(auVar26,auVar13,auVar85);
        auVar27._4_4_ = auVar70._4_4_ * fStack_28d0;
        auVar27._0_4_ = auVar70._0_4_ * fStack_28d0;
        auVar27._8_4_ = auVar70._8_4_ * fStack_28d0;
        auVar27._12_4_ = auVar70._12_4_ * fStack_28d0;
        auVar27._16_4_ = fStack_28d0 * 0.0;
        auVar27._20_4_ = fStack_28d0 * 0.0;
        auVar27._24_4_ = fStack_28d0 * 0.0;
        auVar27._28_4_ = auVar85._28_4_;
        auVar81 = vfmadd231ps_fma(auVar27,auVar161,ZEXT1632(auVar81));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar116,ZEXT1632(auVar88));
        auVar14 = vsubps_avx(auVar73,auVar75);
        auVar92._0_4_ = auVar73._0_4_ + auVar75._0_4_;
        auVar92._4_4_ = auVar73._4_4_ + auVar75._4_4_;
        auVar92._8_4_ = auVar73._8_4_ + auVar75._8_4_;
        auVar92._12_4_ = auVar73._12_4_ + auVar75._12_4_;
        auVar92._16_4_ = auVar73._16_4_ + auVar75._16_4_;
        auVar92._20_4_ = auVar73._20_4_ + auVar75._20_4_;
        auVar92._24_4_ = auVar73._24_4_ + auVar75._24_4_;
        auVar92._28_4_ = auVar73._28_4_ + auVar75._28_4_;
        auVar75 = vsubps_avx(auVar90,auVar11);
        auVar104._0_4_ = auVar90._0_4_ + auVar11._0_4_;
        auVar104._4_4_ = auVar90._4_4_ + auVar11._4_4_;
        auVar104._8_4_ = auVar90._8_4_ + auVar11._8_4_;
        auVar104._12_4_ = auVar90._12_4_ + auVar11._12_4_;
        auVar104._16_4_ = auVar90._16_4_ + auVar11._16_4_;
        auVar104._20_4_ = auVar90._20_4_ + auVar11._20_4_;
        auVar104._24_4_ = auVar90._24_4_ + auVar11._24_4_;
        auVar104._28_4_ = auVar90._28_4_ + auVar11._28_4_;
        auVar11 = vsubps_avx(auVar79,auVar12);
        auVar76._0_4_ = auVar79._0_4_ + auVar12._0_4_;
        auVar76._4_4_ = auVar79._4_4_ + auVar12._4_4_;
        auVar76._8_4_ = auVar79._8_4_ + auVar12._8_4_;
        auVar76._12_4_ = auVar79._12_4_ + auVar12._12_4_;
        auVar76._16_4_ = auVar79._16_4_ + auVar12._16_4_;
        auVar76._20_4_ = auVar79._20_4_ + auVar12._20_4_;
        auVar76._24_4_ = auVar79._24_4_ + auVar12._24_4_;
        auVar76._28_4_ = auVar79._28_4_ + auVar12._28_4_;
        auVar112._0_4_ = auVar11._0_4_ * auVar104._0_4_;
        auVar112._4_4_ = auVar11._4_4_ * auVar104._4_4_;
        auVar112._8_4_ = auVar11._8_4_ * auVar104._8_4_;
        auVar112._12_4_ = auVar11._12_4_ * auVar104._12_4_;
        auVar112._16_4_ = auVar11._16_4_ * auVar104._16_4_;
        auVar112._20_4_ = auVar11._20_4_ * auVar104._20_4_;
        auVar112._24_4_ = auVar11._24_4_ * auVar104._24_4_;
        auVar112._28_4_ = 0;
        auVar70 = vfmsub231ps_fma(auVar112,auVar75,auVar76);
        auVar79._4_4_ = auVar76._4_4_ * auVar14._4_4_;
        auVar79._0_4_ = auVar76._0_4_ * auVar14._0_4_;
        auVar79._8_4_ = auVar76._8_4_ * auVar14._8_4_;
        auVar79._12_4_ = auVar76._12_4_ * auVar14._12_4_;
        auVar79._16_4_ = auVar76._16_4_ * auVar14._16_4_;
        auVar79._20_4_ = auVar76._20_4_ * auVar14._20_4_;
        auVar79._24_4_ = auVar76._24_4_ * auVar14._24_4_;
        auVar79._28_4_ = auVar76._28_4_;
        auVar88 = vfmsub231ps_fma(auVar79,auVar11,auVar92);
        auVar28._4_4_ = auVar75._4_4_ * auVar92._4_4_;
        auVar28._0_4_ = auVar75._0_4_ * auVar92._0_4_;
        auVar28._8_4_ = auVar75._8_4_ * auVar92._8_4_;
        auVar28._12_4_ = auVar75._12_4_ * auVar92._12_4_;
        auVar28._16_4_ = auVar75._16_4_ * auVar92._16_4_;
        auVar28._20_4_ = auVar75._20_4_ * auVar92._20_4_;
        auVar28._24_4_ = auVar75._24_4_ * auVar92._24_4_;
        auVar28._28_4_ = auVar92._28_4_;
        auVar101 = vfmsub231ps_fma(auVar28,auVar14,auVar104);
        fStack_28dc = fStack_28d0;
        local_28e0 = fStack_28d0;
        fStack_28d8 = fStack_28d0;
        fStack_28d4 = fStack_28d0;
        auVar93._0_4_ = fStack_28d0 * auVar101._0_4_;
        auVar93._4_4_ = fStack_28d0 * auVar101._4_4_;
        auVar93._8_4_ = fStack_28d0 * auVar101._8_4_;
        auVar93._12_4_ = fStack_28d0 * auVar101._12_4_;
        auVar93._16_4_ = fStack_28d0 * 0.0;
        auVar93._20_4_ = fStack_28d0 * 0.0;
        auVar93._24_4_ = fStack_28d0 * 0.0;
        auVar93._28_4_ = 0;
        auVar88 = vfmadd231ps_fma(auVar93,auVar161,ZEXT1632(auVar88));
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar116,ZEXT1632(auVar70));
        local_26a0 = ZEXT1632(CONCAT412(auVar88._12_4_ + auVar69._12_4_ + auVar81._12_4_,
                                        CONCAT48(auVar88._8_4_ + auVar69._8_4_ + auVar81._8_4_,
                                                 CONCAT44(auVar88._4_4_ +
                                                          auVar69._4_4_ + auVar81._4_4_,
                                                          auVar88._0_4_ +
                                                          auVar69._0_4_ + auVar81._0_4_))));
        auVar77._8_4_ = 0x7fffffff;
        auVar77._0_8_ = 0x7fffffff7fffffff;
        auVar77._12_4_ = 0x7fffffff;
        auVar77._16_4_ = 0x7fffffff;
        auVar77._20_4_ = 0x7fffffff;
        auVar77._24_4_ = 0x7fffffff;
        auVar77._28_4_ = 0x7fffffff;
        local_2940 = ZEXT1632(auVar69);
        auVar73 = vminps_avx(local_2940,ZEXT1632(auVar81));
        auVar73 = vminps_avx(auVar73,ZEXT1632(auVar88));
        local_2960 = vandps_avx(local_26a0,auVar77);
        fVar118 = local_2960._0_4_ * 1.1920929e-07;
        fVar124 = local_2960._4_4_ * 1.1920929e-07;
        auVar29._4_4_ = fVar124;
        auVar29._0_4_ = fVar118;
        fVar125 = local_2960._8_4_ * 1.1920929e-07;
        auVar29._8_4_ = fVar125;
        fVar126 = local_2960._12_4_ * 1.1920929e-07;
        auVar29._12_4_ = fVar126;
        fVar127 = local_2960._16_4_ * 1.1920929e-07;
        auVar29._16_4_ = fVar127;
        fVar128 = local_2960._20_4_ * 1.1920929e-07;
        auVar29._20_4_ = fVar128;
        fVar129 = local_2960._24_4_ * 1.1920929e-07;
        auVar29._24_4_ = fVar129;
        auVar29._28_4_ = 0x34000000;
        auVar113._0_8_ = CONCAT44(fVar124,fVar118) ^ 0x8000000080000000;
        auVar113._8_4_ = -fVar125;
        auVar113._12_4_ = -fVar126;
        auVar113._16_4_ = -fVar127;
        auVar113._20_4_ = -fVar128;
        auVar113._24_4_ = -fVar129;
        auVar113._28_4_ = 0xb4000000;
        auVar73 = vcmpps_avx(auVar73,auVar113,5);
        auVar79 = vmaxps_avx(local_2940,ZEXT1632(auVar81));
        auVar90 = vmaxps_avx(auVar79,ZEXT1632(auVar88));
        auVar90 = vcmpps_avx(auVar90,auVar29,2);
        auVar90 = vorps_avx(auVar73,auVar90);
        if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar90 >> 0x7f,0) != '\0') ||
              (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar90 >> 0xbf,0) != '\0') ||
            (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar90[0x1f] < '\0') {
          auVar30._4_4_ = local_28a0._4_4_ * fVar109;
          auVar30._0_4_ = local_28a0._0_4_ * fVar106;
          auVar30._8_4_ = local_28a0._8_4_ * fVar144;
          auVar30._12_4_ = local_28a0._12_4_ * fVar147;
          auVar30._16_4_ = local_28a0._16_4_ * fVar150;
          auVar30._20_4_ = local_28a0._20_4_ * fVar153;
          auVar30._24_4_ = local_28a0._24_4_ * fVar156;
          auVar30._28_4_ = auVar73._28_4_;
          auVar31._4_4_ = fVar108 * local_28c0._4_4_;
          auVar31._0_4_ = fVar100 * local_28c0._0_4_;
          auVar31._8_4_ = fVar142 * local_28c0._8_4_;
          auVar31._12_4_ = fVar146 * local_28c0._12_4_;
          auVar31._16_4_ = fVar149 * local_28c0._16_4_;
          auVar31._20_4_ = fVar152 * local_28c0._20_4_;
          auVar31._24_4_ = fVar155 * local_28c0._24_4_;
          auVar31._28_4_ = 0x34000000;
          auVar88 = vfmsub213ps_fma(local_28c0,local_2920,auVar30);
          auVar32._4_4_ = auVar75._4_4_ * fVar107;
          auVar32._0_4_ = auVar75._0_4_ * fVar105;
          auVar32._8_4_ = auVar75._8_4_ * fVar110;
          auVar32._12_4_ = auVar75._12_4_ * fVar145;
          auVar32._16_4_ = auVar75._16_4_ * fVar148;
          auVar32._20_4_ = auVar75._20_4_ * fVar151;
          auVar32._24_4_ = auVar75._24_4_ * fVar154;
          auVar32._28_4_ = auVar79._28_4_;
          auVar33._4_4_ = fVar108 * auVar11._4_4_;
          auVar33._0_4_ = fVar100 * auVar11._0_4_;
          auVar33._8_4_ = fVar142 * auVar11._8_4_;
          auVar33._12_4_ = fVar146 * auVar11._12_4_;
          auVar33._16_4_ = fVar149 * auVar11._16_4_;
          auVar33._20_4_ = fVar152 * auVar11._20_4_;
          auVar33._24_4_ = fVar155 * auVar11._24_4_;
          auVar33._28_4_ = local_2960._28_4_;
          auVar70 = vfmsub213ps_fma(auVar11,local_2900,auVar32);
          auVar73 = vandps_avx(auVar30,auVar77);
          auVar79 = vandps_avx(auVar32,auVar77);
          auVar73 = vcmpps_avx(auVar73,auVar79,1);
          local_2680 = vblendvps_avx(ZEXT1632(auVar70),ZEXT1632(auVar88),auVar73);
          auVar34._4_4_ = auVar14._4_4_ * fVar109;
          auVar34._0_4_ = auVar14._0_4_ * fVar106;
          auVar34._8_4_ = auVar14._8_4_ * fVar144;
          auVar34._12_4_ = auVar14._12_4_ * fVar147;
          auVar34._16_4_ = auVar14._16_4_ * fVar150;
          auVar34._20_4_ = auVar14._20_4_ * fVar153;
          auVar34._24_4_ = auVar14._24_4_ * fVar156;
          auVar34._28_4_ = auVar73._28_4_;
          auVar88 = vfmsub213ps_fma(auVar14,local_2920,auVar33);
          auVar35._4_4_ = local_2880._4_4_ * fVar107;
          auVar35._0_4_ = local_2880._0_4_ * fVar105;
          auVar35._8_4_ = local_2880._8_4_ * fVar110;
          auVar35._12_4_ = local_2880._12_4_ * fVar145;
          auVar35._16_4_ = local_2880._16_4_ * fVar148;
          auVar35._20_4_ = local_2880._20_4_ * fVar151;
          auVar35._24_4_ = local_2880._24_4_ * fVar154;
          auVar35._28_4_ = auVar79._28_4_;
          auVar70 = vfmsub213ps_fma(local_28a0,auVar13,auVar35);
          auVar73 = vandps_avx(auVar35,auVar77);
          auVar79 = vandps_avx(auVar33,auVar77);
          auVar73 = vcmpps_avx(auVar73,auVar79,1);
          local_2660 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar70),auVar73);
          auVar88 = vfmsub213ps_fma(local_2880,local_2900,auVar31);
          auVar70 = vfmsub213ps_fma(auVar75,auVar13,auVar34);
          auVar73 = vandps_avx(auVar31,auVar77);
          auVar79 = vandps_avx(auVar34,auVar77);
          auVar79 = vcmpps_avx(auVar73,auVar79,1);
          local_2640 = vblendvps_avx(ZEXT1632(auVar70),ZEXT1632(auVar88),auVar79);
          auVar88 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
          fVar100 = local_2640._0_4_;
          auVar78._0_4_ = fVar100 * fStack_28d0;
          fVar105 = local_2640._4_4_;
          auVar78._4_4_ = fVar105 * fStack_28d0;
          fVar106 = local_2640._8_4_;
          auVar78._8_4_ = fVar106 * fStack_28d0;
          fVar107 = local_2640._12_4_;
          auVar78._12_4_ = fVar107 * fStack_28d0;
          fVar108 = local_2640._16_4_;
          auVar78._16_4_ = fVar108 * fStack_28d0;
          fVar109 = local_2640._20_4_;
          auVar78._20_4_ = fVar109 * fStack_28d0;
          fVar110 = local_2640._24_4_;
          auVar78._24_4_ = fVar110 * fStack_28d0;
          auVar78._28_4_ = 0;
          auVar70 = vfmadd213ps_fma(auVar161,local_2660,auVar78);
          auVar70 = vfmadd213ps_fma(auVar116,local_2680,ZEXT1632(auVar70));
          auVar79 = ZEXT1632(CONCAT412(auVar70._12_4_ + auVar70._12_4_,
                                       CONCAT48(auVar70._8_4_ + auVar70._8_4_,
                                                CONCAT44(auVar70._4_4_ + auVar70._4_4_,
                                                         auVar70._0_4_ + auVar70._0_4_))));
          auVar36._4_4_ = fVar105 * fVar134;
          auVar36._0_4_ = fVar100 * fVar130;
          auVar36._8_4_ = fVar106 * fVar135;
          auVar36._12_4_ = fVar107 * fVar136;
          auVar36._16_4_ = fVar108 * fVar137;
          auVar36._20_4_ = fVar109 * fVar138;
          auVar36._24_4_ = fVar110 * fVar139;
          auVar36._28_4_ = auVar73._28_4_;
          auVar70 = vfmadd213ps_fma(local_2840,local_2660,auVar36);
          auVar101 = vfmadd213ps_fma(local_2820,local_2680,ZEXT1632(auVar70));
          auVar73 = vrcpps_avx(auVar79);
          auVar141._8_4_ = 0x3f800000;
          auVar141._0_8_ = &DAT_3f8000003f800000;
          auVar141._12_4_ = 0x3f800000;
          auVar141._16_4_ = 0x3f800000;
          auVar141._20_4_ = 0x3f800000;
          auVar141._24_4_ = 0x3f800000;
          auVar141._28_4_ = 0x3f800000;
          auVar70 = vfnmadd213ps_fma(auVar73,auVar79,auVar141);
          auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar73,auVar73);
          local_25c0._28_4_ = 0x3f800000;
          local_25c0._0_28_ =
               ZEXT1628(CONCAT412(auVar70._12_4_ * (auVar101._12_4_ + auVar101._12_4_),
                                  CONCAT48(auVar70._8_4_ * (auVar101._8_4_ + auVar101._8_4_),
                                           CONCAT44(auVar70._4_4_ *
                                                    (auVar101._4_4_ + auVar101._4_4_),
                                                    auVar70._0_4_ *
                                                    (auVar101._0_4_ + auVar101._0_4_)))));
          auVar68 = ZEXT3264(local_25c0);
          uVar1 = *(undefined4 *)(local_2a08 + k * 4 + 0x30);
          auVar98._4_4_ = uVar1;
          auVar98._0_4_ = uVar1;
          auVar98._8_4_ = uVar1;
          auVar98._12_4_ = uVar1;
          auVar98._16_4_ = uVar1;
          auVar98._20_4_ = uVar1;
          auVar98._24_4_ = uVar1;
          auVar98._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_2a08 + k * 4 + 0x80);
          auVar122._4_4_ = uVar1;
          auVar122._0_4_ = uVar1;
          auVar122._8_4_ = uVar1;
          auVar122._12_4_ = uVar1;
          auVar122._16_4_ = uVar1;
          auVar122._20_4_ = uVar1;
          auVar122._24_4_ = uVar1;
          auVar122._28_4_ = uVar1;
          auVar73 = vcmpps_avx(auVar98,local_25c0,2);
          auVar90 = vcmpps_avx(local_25c0,auVar122,2);
          auVar73 = vandps_avx(auVar90,auVar73);
          auVar70 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
          auVar88 = vpand_avx(auVar70,auVar88);
          auVar73 = vpmovsxwd_avx2(auVar88);
          if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar73 >> 0x7f,0) != '\0') ||
                (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar73 >> 0xbf,0) != '\0') ||
              (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar73[0x1f] < '\0') {
            auVar73 = vcmpps_avx(auVar79,_DAT_02020f00,4);
            auVar70 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
            auVar88 = vpand_avx(auVar88,auVar70);
            local_29a0 = vpmovsxwd_avx2(auVar88);
            if ((((((((local_29a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_29a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_29a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_29a0 >> 0x7f,0) != '\0') ||
                  (local_29a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_29a0 >> 0xbf,0) != '\0') ||
                (local_29a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_29a0[0x1f] < '\0') {
              local_26e0 = ZEXT1632(auVar69);
              local_26c0 = ZEXT1632(auVar81);
              local_2620 = local_29a0;
              local_2540 = local_23e0;
              auVar73 = vrcpps_avx(local_26a0);
              auVar133._8_4_ = 0x3f800000;
              auVar133._0_8_ = &DAT_3f8000003f800000;
              auVar133._12_4_ = 0x3f800000;
              auVar133._16_4_ = 0x3f800000;
              auVar133._20_4_ = 0x3f800000;
              auVar133._24_4_ = 0x3f800000;
              auVar133._28_4_ = 0x3f800000;
              auVar70 = vfnmadd213ps_fma(local_26a0,auVar73,auVar133);
              auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar73,auVar73);
              auVar99._8_4_ = 0x219392ef;
              auVar99._0_8_ = 0x219392ef219392ef;
              auVar99._12_4_ = 0x219392ef;
              auVar99._16_4_ = 0x219392ef;
              auVar99._20_4_ = 0x219392ef;
              auVar99._24_4_ = 0x219392ef;
              auVar99._28_4_ = 0x219392ef;
              auVar73 = vcmpps_avx(local_2960,auVar99,5);
              auVar73 = vandps_avx(auVar73,ZEXT1632(auVar70));
              auVar37._4_4_ = auVar69._4_4_ * auVar73._4_4_;
              auVar37._0_4_ = auVar69._0_4_ * auVar73._0_4_;
              auVar37._8_4_ = auVar69._8_4_ * auVar73._8_4_;
              auVar37._12_4_ = auVar69._12_4_ * auVar73._12_4_;
              auVar37._16_4_ = auVar73._16_4_ * 0.0;
              auVar37._20_4_ = auVar73._20_4_ * 0.0;
              auVar37._24_4_ = auVar73._24_4_ * 0.0;
              auVar37._28_4_ = 0;
              auVar90 = vminps_avx(auVar37,auVar133);
              auVar86._0_4_ = auVar81._0_4_ * auVar73._0_4_;
              auVar86._4_4_ = auVar81._4_4_ * auVar73._4_4_;
              auVar86._8_4_ = auVar81._8_4_ * auVar73._8_4_;
              auVar86._12_4_ = auVar81._12_4_ * auVar73._12_4_;
              auVar86._16_4_ = auVar73._16_4_ * 0.0;
              auVar86._20_4_ = auVar73._20_4_ * 0.0;
              auVar86._24_4_ = auVar73._24_4_ * 0.0;
              auVar86._28_4_ = 0;
              auVar73 = vminps_avx(auVar86,auVar133);
              auVar79 = vsubps_avx(auVar133,auVar90);
              auVar75 = vsubps_avx(auVar133,auVar73);
              local_25e0 = vblendvps_avx(auVar73,auVar79,local_23e0);
              local_2600 = vblendvps_avx(auVar90,auVar75,local_23e0);
              local_25a0[0] = local_2680._0_4_ * (float)local_2400._0_4_;
              local_25a0[1] = local_2680._4_4_ * (float)local_2400._4_4_;
              local_25a0[2] = local_2680._8_4_ * fStack_23f8;
              local_25a0[3] = local_2680._12_4_ * fStack_23f4;
              fStack_2590 = local_2680._16_4_ * fStack_23f0;
              fStack_258c = local_2680._20_4_ * fStack_23ec;
              fStack_2588 = local_2680._24_4_ * fStack_23e8;
              uStack_2584 = local_2600._28_4_;
              local_2580[0] = (float)local_2400._0_4_ * local_2660._0_4_;
              local_2580[1] = (float)local_2400._4_4_ * local_2660._4_4_;
              local_2580[2] = fStack_23f8 * local_2660._8_4_;
              local_2580[3] = fStack_23f4 * local_2660._12_4_;
              fStack_2570 = fStack_23f0 * local_2660._16_4_;
              fStack_256c = fStack_23ec * local_2660._20_4_;
              fStack_2568 = fStack_23e8 * local_2660._24_4_;
              uStack_2564 = local_25e0._28_4_;
              local_2560[0] = (float)local_2400._0_4_ * fVar100;
              local_2560[1] = (float)local_2400._4_4_ * fVar105;
              local_2560[2] = fStack_23f8 * fVar106;
              local_2560[3] = fStack_23f4 * fVar107;
              fStack_2550 = fStack_23f0 * fVar108;
              fStack_254c = fStack_23ec * fVar109;
              fStack_2548 = fStack_23e8 * fVar110;
              uStack_2544 = uStack_23e4;
              auVar73 = vpmovsxwd_avx2(auVar88);
              auVar87._8_4_ = 0x7f800000;
              auVar87._0_8_ = 0x7f8000007f800000;
              auVar87._12_4_ = 0x7f800000;
              auVar87._16_4_ = 0x7f800000;
              auVar87._20_4_ = 0x7f800000;
              auVar87._24_4_ = 0x7f800000;
              auVar87._28_4_ = 0x7f800000;
              auVar73 = vblendvps_avx(auVar87,local_25c0,auVar73);
              auVar90 = vshufps_avx(auVar73,auVar73,0xb1);
              auVar90 = vminps_avx(auVar73,auVar90);
              auVar79 = vshufpd_avx(auVar90,auVar90,5);
              auVar90 = vminps_avx(auVar90,auVar79);
              auVar79 = vpermpd_avx2(auVar90,0x4e);
              auVar90 = vminps_avx(auVar90,auVar79);
              auVar73 = vcmpps_avx(auVar73,auVar90,0);
              auVar69 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
              auVar69 = vpand_avx(auVar69,auVar88);
              auVar73 = vpmovsxwd_avx2(auVar69);
              if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar73 >> 0x7f,0) == '\0') &&
                    (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar73 >> 0xbf,0) == '\0') &&
                  (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar73[0x1f]) {
                auVar73 = local_29a0;
              }
              auVar114 = ZEXT3264(auVar73);
              auVar69 = vpcmpeqd_avx(auVar75._0_16_,auVar75._0_16_);
              auVar117 = ZEXT1664(auVar69);
              fStack_28cc = fStack_28d0;
              fStack_28c8 = fStack_28d0;
              fStack_28c4 = fStack_28d0;
LAB_0067070a:
              uVar39 = vmovmskps_avx(auVar114._0_32_);
              uVar16 = 0;
              for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x80000000) {
                uVar16 = uVar16 + 1;
              }
              uVar44 = (ulong)uVar16;
              local_2710 = *(uint *)((long)&local_23c0 + uVar44 * 4);
              pGVar7 = (pSVar5->geometries).items[local_2710].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_29a0 + uVar44 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar44 = (ulong)(uVar16 << 2);
                  uVar1 = *(undefined4 *)(local_2600 + uVar44);
                  uVar2 = *(undefined4 *)(local_25e0 + uVar44);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar44);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_25a0 + uVar44);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_2580 + uVar44);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_2560 + uVar44);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_27a0 + uVar44)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = local_2710;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_00670b1c;
                }
                uVar42 = (ulong)(uVar16 * 4);
                uVar1 = *(undefined4 *)(local_2600 + uVar42);
                local_2740._4_4_ = uVar1;
                local_2740._0_4_ = uVar1;
                local_2740._8_4_ = uVar1;
                local_2740._12_4_ = uVar1;
                local_2730 = *(undefined4 *)(local_25e0 + uVar42);
                local_2720 = *(undefined4 *)((long)&local_27a0 + uVar42);
                uVar1 = *(undefined4 *)((long)local_25a0 + uVar42);
                uVar2 = *(undefined4 *)((long)local_2580 + uVar42);
                local_2760._4_4_ = uVar2;
                local_2760._0_4_ = uVar2;
                local_2760._8_4_ = uVar2;
                local_2760._12_4_ = uVar2;
                uVar2 = *(undefined4 *)((long)local_2560 + uVar42);
                local_2750._4_4_ = uVar2;
                local_2750._0_4_ = uVar2;
                local_2750._8_4_ = uVar2;
                local_2750._12_4_ = uVar2;
                local_2770[0] = (RTCHitN)(char)uVar1;
                local_2770[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_2770[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_2770[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_2770[4] = (RTCHitN)(char)uVar1;
                local_2770[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_2770[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_2770[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_2770[8] = (RTCHitN)(char)uVar1;
                local_2770[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_2770[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_2770[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_2770[0xc] = (RTCHitN)(char)uVar1;
                local_2770[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_2770[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_2770[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                uStack_272c = local_2730;
                uStack_2728 = local_2730;
                uStack_2724 = local_2730;
                uStack_271c = local_2720;
                uStack_2718 = local_2720;
                uStack_2714 = local_2720;
                uStack_270c = local_2710;
                uStack_2708 = local_2710;
                uStack_2704 = local_2710;
                vpcmpeqd_avx2(ZEXT1632(local_2740),ZEXT1632(local_2740));
                uStack_26fc = context->user->instID[0];
                local_2700 = uStack_26fc;
                uStack_26f8 = uStack_26fc;
                uStack_26f4 = uStack_26fc;
                uStack_26f0 = context->user->instPrimID[0];
                uStack_26ec = uStack_26f0;
                uStack_26e8 = uStack_26f0;
                uStack_26e4 = uStack_26f0;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25c0 + uVar42);
                local_2a40 = *local_2a30;
                uStack_2a38 = local_2a30[1];
                local_29d0.valid = (int *)&local_2a40;
                local_29d0.geometryUserPtr = pGVar7->userPtr;
                local_29d0.context = context->user;
                local_29d0.ray = (RTCRayN *)ray;
                local_29d0.hit = local_2770;
                local_29d0.N = 4;
                auVar73 = auVar68._0_32_;
                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar69 = auVar117._0_16_;
                  (*pGVar7->intersectionFilterN)(&local_29d0);
                  auVar68 = ZEXT3264(auVar73);
                  auVar69 = vpcmpeqd_avx(auVar69,auVar69);
                  auVar117 = ZEXT1664(auVar69);
                }
                auVar3._8_8_ = uStack_2a38;
                auVar3._0_8_ = local_2a40;
                auVar69 = auVar117._0_16_;
                if (auVar3 == (undefined1  [16])0x0) {
                  auVar81 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar81 = auVar81 ^ auVar69;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var10)(&local_29d0);
                    auVar68 = ZEXT3264(auVar73);
                    auVar69 = vpcmpeqd_avx(auVar69,auVar69);
                    auVar117 = ZEXT1664(auVar69);
                  }
                  auVar4._8_8_ = uStack_2a38;
                  auVar4._0_8_ = local_2a40;
                  auVar69 = vpcmpeqd_avx(auVar4,_DAT_01feba10);
                  auVar81 = auVar69 ^ auVar117._0_16_;
                  if (auVar4 != (undefined1  [16])0x0) {
                    auVar69 = auVar69 ^ auVar117._0_16_;
                    auVar88 = vmaskmovps_avx(auVar69,*(undefined1 (*) [16])local_29d0.hit);
                    *(undefined1 (*) [16])(local_29d0.ray + 0xc0) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar69,*(undefined1 (*) [16])(local_29d0.hit + 0x10));
                    *(undefined1 (*) [16])(local_29d0.ray + 0xd0) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar69,*(undefined1 (*) [16])(local_29d0.hit + 0x20));
                    *(undefined1 (*) [16])(local_29d0.ray + 0xe0) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar69,*(undefined1 (*) [16])(local_29d0.hit + 0x30));
                    *(undefined1 (*) [16])(local_29d0.ray + 0xf0) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar69,*(undefined1 (*) [16])(local_29d0.hit + 0x40));
                    *(undefined1 (*) [16])(local_29d0.ray + 0x100) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar69,*(undefined1 (*) [16])(local_29d0.hit + 0x50));
                    *(undefined1 (*) [16])(local_29d0.ray + 0x110) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar69,*(undefined1 (*) [16])(local_29d0.hit + 0x60));
                    *(undefined1 (*) [16])(local_29d0.ray + 0x120) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar69,*(undefined1 (*) [16])(local_29d0.hit + 0x70));
                    *(undefined1 (*) [16])(local_29d0.ray + 0x130) = auVar88;
                    auVar69 = vmaskmovps_avx(auVar69,*(undefined1 (*) [16])(local_29d0.hit + 0x80));
                    *(undefined1 (*) [16])(local_29d0.ray + 0x140) = auVar69;
                  }
                }
                auVar72._8_8_ = 0x100000001;
                auVar72._0_8_ = 0x100000001;
                if ((auVar72 & auVar81) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
                }
                *(undefined4 *)(local_29a0 + uVar44 * 4) = 0;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar67._4_4_ = uVar1;
                auVar67._0_4_ = uVar1;
                auVar67._8_4_ = uVar1;
                auVar67._12_4_ = uVar1;
                auVar67._16_4_ = uVar1;
                auVar67._20_4_ = uVar1;
                auVar67._24_4_ = uVar1;
                auVar67._28_4_ = uVar1;
                auVar73 = vcmpps_avx(auVar68._0_32_,auVar67,2);
                local_29a0 = vandps_avx(auVar73,local_29a0);
              }
              auVar114 = ZEXT3264(local_29a0);
              if ((((((((local_29a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_29a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_29a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_29a0 >> 0x7f,0) == '\0') &&
                    (local_29a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_29a0 >> 0xbf,0) == '\0') &&
                  (local_29a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_29a0[0x1f]) goto LAB_00670b1c;
              auVar80._8_4_ = 0x7f800000;
              auVar80._0_8_ = 0x7f8000007f800000;
              auVar80._12_4_ = 0x7f800000;
              auVar80._16_4_ = 0x7f800000;
              auVar80._20_4_ = 0x7f800000;
              auVar80._24_4_ = 0x7f800000;
              auVar80._28_4_ = 0x7f800000;
              auVar73 = vblendvps_avx(auVar80,auVar68._0_32_,local_29a0);
              auVar90 = vshufps_avx(auVar73,auVar73,0xb1);
              auVar90 = vminps_avx(auVar73,auVar90);
              auVar79 = vshufpd_avx(auVar90,auVar90,5);
              auVar90 = vminps_avx(auVar90,auVar79);
              auVar79 = vpermpd_avx2(auVar90,0x4e);
              auVar90 = vminps_avx(auVar90,auVar79);
              auVar73 = vcmpps_avx(auVar73,auVar90,0);
              auVar90 = local_29a0 & auVar73;
              if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar90 >> 0x7f,0) != '\0') ||
                    (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar90 >> 0xbf,0) != '\0') ||
                  (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar90[0x1f] < '\0') {
                auVar73 = vandps_avx(auVar73,local_29a0);
                auVar114 = ZEXT3264(auVar73);
              }
              goto LAB_0067070a;
            }
          }
        }
LAB_00670b1c:
        local_29d8 = local_29d8 + 1;
        pRVar62 = ray;
      } while (local_29d8 != local_2a00);
    }
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar68 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
    auVar114 = ZEXT3264(local_2420);
    auVar117 = ZEXT3264(local_2440);
    auVar123 = ZEXT3264(local_2460);
    auVar170 = ZEXT3264(local_2980);
    uVar44 = local_2a20;
    uVar42 = local_2a18;
    uVar48 = local_2a28;
    fVar130 = local_2480;
    fVar134 = fStack_247c;
    fVar135 = fStack_2478;
    fVar136 = fStack_2474;
    fVar137 = fStack_2470;
    fVar138 = fStack_246c;
    fVar139 = fStack_2468;
    fVar100 = local_24a0;
    fVar105 = fStack_249c;
    fVar106 = fStack_2498;
    fVar107 = fStack_2494;
    fVar108 = fStack_2490;
    fVar109 = fStack_248c;
    fVar110 = fStack_2488;
    fVar142 = local_24c0;
    fVar144 = fStack_24bc;
    fVar145 = fStack_24b8;
    fVar146 = fStack_24b4;
    fVar147 = fStack_24b0;
    fVar148 = fStack_24ac;
    fVar149 = fStack_24a8;
    fVar150 = local_24e0;
    fVar151 = fStack_24dc;
    fVar152 = fStack_24d8;
    fVar153 = fStack_24d4;
    fVar154 = fStack_24d0;
    fVar155 = fStack_24cc;
    fVar156 = fStack_24c8;
    fVar118 = local_2500;
    fVar124 = fStack_24fc;
    fVar125 = fStack_24f8;
    fVar126 = fStack_24f4;
    fVar127 = fStack_24f0;
    fVar128 = fStack_24ec;
    fVar129 = fStack_24e8;
    fVar158 = local_2520;
    fVar162 = fStack_251c;
    fVar163 = fStack_2518;
    fVar164 = fStack_2514;
    fVar165 = fStack_2510;
    fVar166 = fStack_250c;
    fVar167 = fStack_2508;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }